

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O1

VirtualIterator<Kernel::TermList> Lib::VirtualIterator<Kernel::TermList>::getEmpty(void)

{
  int *piVar1;
  VirtualIterator<Kernel::TermList> VVar2;
  int iVar3;
  IteratorCore<Kernel::TermList> *in_RDI;
  
  if (getEmpty()::inst == '\0') {
    iVar3 = __cxa_guard_acquire(&getEmpty()::inst);
    if (iVar3 != 0) {
      getEmpty::inst._core =
           (IteratorCore<Kernel::TermList> *)
           FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      (getEmpty::inst._core)->_refCnt = 0;
      (getEmpty::inst._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b638f8;
      (getEmpty::inst._core)->_refCnt = 1;
      __cxa_atexit(~VirtualIterator,&getEmpty::inst,&__dso_handle);
      __cxa_guard_release(&getEmpty()::inst);
    }
  }
  VVar2._core = getEmpty::inst._core;
  in_RDI->_vptr_IteratorCore = (_func_int **)getEmpty::inst._core;
  if (VVar2._core != (IteratorCore<Kernel::TermList> *)0x0) {
    piVar1 = &(VVar2._core)->_refCnt;
    *piVar1 = *piVar1 + 1;
  }
  return (VirtualIterator<Kernel::TermList>)in_RDI;
}

Assistant:

static VirtualIterator getEmpty()
  {
    static VirtualIterator inst(new EmptyIterator<T>());
    return inst;
  }